

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O0

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context::
Context(Context *this,PIT *pit,DMA *dma,PPI *ppi,PIC *pic,type *card,FloppyController *fdc,RTC *rtc)

{
  type *card_local;
  PIC *pic_local;
  PPI *ppi_local;
  DMA *dma_local;
  PIT *pit_local;
  Context *this_local;
  
  Segments::Segments(&this->segments,&this->registers);
  Memory::Memory(&this->memory,&this->registers,&this->segments);
  FlowController::FlowController(&this->flow_controller,&this->registers,&this->segments);
  IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::IO
            (&this->io,pit,dma,ppi,pic,card,fdc,rtc);
  reset(this);
  return;
}

Assistant:

Context(PIT &pit, DMA &dma, PPI &ppi, PIC &pic, typename Adaptor<video>::type &card, FloppyController &fdc, RTC &rtc) :
				segments(registers),
				memory(registers, segments),
				flow_controller(registers, segments),
				io(pit, dma, ppi, pic, card, fdc, rtc)
			{
				reset();
			}